

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationBuilder::ignoreString
          (CollationBuilder *this,UnicodeString *s,UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  char16_t *pcVar3;
  bool bVar4;
  
  bVar4 = true;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = (*(this->fcd->super_UObject)._vptr_UObject[0xb])();
    if ((char)iVar2 != '\0') {
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      if (iVar2 == 0) {
        bVar4 = false;
      }
      else {
        if (((int)sVar1 & 2U) == 0) {
          pcVar3 = (s->fUnion).fFields.fArray;
        }
        else {
          pcVar3 = (s->fUnion).fStackFields.fBuffer;
        }
        bVar4 = (ushort)*pcVar3 - 0xac00 < 0x2ba4;
      }
    }
  }
  return bVar4;
}

Assistant:

UBool
CollationBuilder::ignoreString(const UnicodeString &s, UErrorCode &errorCode) const {
    // Do not map non-FCD strings.
    // Do not map strings that start with Hangul syllables: We decompose those on the fly.
    return !isFCD(s, errorCode) || Hangul::isHangul(s.charAt(0));
}